

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.h
# Opt level: O0

void __thiscall cmCoreTryCompile::Arguments::Arguments(Arguments *this,cmMakefile *mf)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d [20];
  allocator<char> local_39;
  value_type local_38;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  Arguments *this_local;
  
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  ArgumentParser::ParseResult::ParseResult(&this->super_ParseResult);
  this->Makefile = local_18;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->CompileResultVariable);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->BinaryDirectory);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->SourceDirectoryOrFile);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->ProjectName);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->TargetName);
  std::
  optional<ArgumentParser::NonEmpty<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCoreTryCompile::Arguments::SourceType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCoreTryCompile::Arguments::SourceType>_>_>_>_>
  ::optional(&this->Sources);
  std::
  optional<ArgumentParser::NonEmpty<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCoreTryCompile::Arguments::SourceType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCoreTryCompile::Arguments::SourceType>_>_>_>_>
  ::optional(&this->SourceFromContent);
  std::
  optional<ArgumentParser::NonEmpty<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCoreTryCompile::Arguments::SourceType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCoreTryCompile::Arguments::SourceType>_>_>_>_>
  ::optional(&this->SourceFromVar);
  std::
  optional<ArgumentParser::NonEmpty<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCoreTryCompile::Arguments::SourceType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCoreTryCompile::Arguments::SourceType>_>_>_>_>
  ::optional(&this->SourceFromFile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"CMAKE_FLAGS",&local_39);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_4d);
  ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::MaybeEmpty((MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *
               )&this->CMakeFlags,1,&local_38,local_4d);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_4d);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  cmList::cmList(&this->CompileDefs);
  std::
  optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::optional(&this->LinkLibraries);
  ArgumentParser::
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::MaybeEmpty(&this->LinkOptions);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->LinkerLanguage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->LangProps);
  std::__cxx11::string::string((string *)&this->CMakeInternal);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->OutputVariable);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->CopyFileTo);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->CopyFileError);
  std::
  optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::optional(&this->LogDescription);
  this->NoCache = false;
  this->NoLog = false;
  this->SourceTypeContext = Normal;
  std::__cxx11::string::string((string *)&this->SourceTypeError);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->CompileOutputVariable);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->RunOutputVariable);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->RunOutputStdOutVariable);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->RunOutputStdErrVariable);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->RunWorkingDirectory);
  std::
  optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::optional(&this->RunArgs);
  return;
}

Assistant:

Arguments(cmMakefile const* mf)
      : Makefile(mf)
    {
    }